

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O2

Hsh_IntMan_t * Sdm_ManBuildHashTable(Vec_Int_t **pvConfgRes)

{
  word *__ptr;
  int iVar1;
  uint p;
  int iVar2;
  Vec_Wrd_t *p_00;
  Vec_Int_t *p_01;
  FILE *__stream;
  Vec_Int_t *pVVar3;
  Hsh_IntMan_t *p_02;
  Vec_Wrd_t *p_03;
  ulong uVar4;
  Hsh_IntObj_t *pHVar5;
  uint *puVar6;
  int *piVar7;
  ulong uVar8;
  size_t __n;
  
  iVar1 = Extra_FileSize("dsdfuncs6.dat");
  p = (uint)((long)iVar1 / 0xc);
  p_00 = Vec_WrdAlloc(p);
  p_01 = Vec_IntAlloc(p);
  __stream = fopen("dsdfuncs6.dat","rb");
  __ptr = p_00->pArray;
  __n = (size_t)(int)p;
  fread(__ptr,8,__n,__stream);
  fread(p_01->pArray,4,__n,__stream);
  p_00->nSize = p;
  p_01->nSize = p;
  pVVar3 = Vec_IntAlloc(p * 2);
  memcpy(pVVar3->pArray,__ptr,__n << 3);
  pVVar3->nSize = p * 2;
  p_02 = (Hsh_IntMan_t *)calloc(1,0x20);
  p_02->nSize = 2;
  p_02->vData = pVVar3;
  iVar2 = Abc_PrimeCudd(p);
  pVVar3 = Vec_IntStartFull(iVar2);
  p_02->vTable = pVVar3;
  p_03 = Vec_WrdAlloc(p);
  uVar4 = 0;
  if (0 < (int)p) {
    uVar4 = (long)iVar1 / 0xc & 0xffffffff;
  }
  p_02->vObjs = p_03;
  for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
    if (pVVar3->nSize < p_03->nSize) {
      iVar1 = Abc_PrimeCudd(pVVar3->nSize * 2);
      Vec_IntFill(pVVar3,iVar1,-1);
      for (iVar1 = 0; iVar1 < p_03->nSize; iVar1 = iVar1 + 1) {
        pHVar5 = Hsh_IntObj(p_02,iVar1);
        puVar6 = Hsh_IntData(p_02,pHVar5->iData);
        iVar2 = Hsh_IntManHash(puVar6,2,pVVar3->nSize);
        piVar7 = Vec_IntEntryP(pVVar3,iVar2);
        iVar2 = *piVar7;
        pHVar5 = Hsh_IntObj(p_02,iVar1);
        pHVar5->iNext = iVar2;
        *piVar7 = iVar1;
      }
    }
    puVar6 = Hsh_IntData(p_02,(int)uVar8);
    piVar7 = Hsh_IntManLookup(p_02,puVar6);
    if (*piVar7 == -1) {
      *piVar7 = p_03->nSize;
      Vec_WrdPush(p_03,uVar8 | 0xffffffff00000000);
    }
    else {
      Hsh_IntObj(p_02,*piVar7);
    }
  }
  if (p_03->nSize == p) {
    if (pvConfgRes == (Vec_Int_t **)0x0) {
      Vec_IntFree(p_01);
    }
    else {
      *pvConfgRes = p_01;
    }
    Vec_WrdFree(p_00);
    return p_02;
  }
  __assert_fail("Vec_WrdSize(p->vObjs) == nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                ,0x18a,"Hsh_IntMan_t *Hsh_WrdManHashArrayStart(Vec_Wrd_t *, int)");
}

Assistant:

Hsh_IntMan_t * Sdm_ManBuildHashTable( Vec_Int_t ** pvConfgRes ) 
{
    FILE * pFile;
    char * pFileName = "dsdfuncs6.dat";
    int RetValue, size = Extra_FileSize( pFileName ) / 12;  // 2866420
    Vec_Wrd_t * vTruthRes = Vec_WrdAlloc( size );
    Vec_Int_t * vConfgRes = Vec_IntAlloc( size );
    Hsh_IntMan_t * pHash;

    pFile = fopen( pFileName, "rb" );
    RetValue = fread( Vec_WrdArray(vTruthRes), sizeof(word), size, pFile );
    RetValue = fread( Vec_IntArray(vConfgRes), sizeof(int), size, pFile );
    vTruthRes->nSize = size;
    vConfgRes->nSize = size;
    // create hash table
    pHash = Hsh_WrdManHashArrayStart( vTruthRes, 1 );
    // cleanup
    if ( pvConfgRes )
        *pvConfgRes = vConfgRes;
    else
        Vec_IntFree( vConfgRes );
    Vec_WrdFree( vTruthRes );
//    Hsh_IntManStop( pHash );
    return pHash;
}